

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mo.h
# Opt level: O1

int __thiscall GF2::MOGrevlex<8UL>::Compare(MOGrevlex<8UL> *this,MM<8UL> *m1,MM<8UL> *m2)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  long lVar8;
  
  if (WW<8ul>::Weight()::_bitsperoctet[(byte)(m1->super_WW<8UL>)._words[0]] ==
      WW<8ul>::Weight()::_bitsperoctet[(byte)(m2->super_WW<8UL>)._words[0]]) {
    bVar3 = true;
    lVar1 = 0;
    bVar2 = false;
    do {
      bVar7 = bVar2;
      lVar8 = lVar1;
      if (!bVar3) {
        return 0;
      }
      bVar3 = false;
      lVar1 = 1;
      bVar2 = true;
    } while (m1[lVar8].super_WW<8UL>._words[0] == m2[lVar8].super_WW<8UL>._words[0]);
    if (bVar7) {
      return 0;
    }
    uVar5 = m1[lVar8].super_WW<8UL>._words[0];
    uVar6 = m2[lVar8].super_WW<8UL>._words[0];
    while( true ) {
      if ((uVar5 & 0xff) != (uVar6 & 0xff)) break;
      uVar5 = uVar5 >> 8;
      uVar6 = uVar6 >> 8;
    }
    uVar4 = (""[uVar5 & 0xff] < ""[uVar6 & 0xff]) - 1;
  }
  else {
    uVar4 = -(uint)((byte)WW<8ul>::Weight()::_bitsperoctet[(byte)(m1->super_WW<8UL>)._words[0]] <
                   (byte)WW<8ul>::Weight()::_bitsperoctet[(byte)(m2->super_WW<8UL>)._words[0]]);
  }
  return uVar4 | 1;
}

Assistant:

int Compare(const MM<_n>& m1, const MM<_n>& m2) const
	{
		int nDiff = m1.Deg() - m2.Deg();
		// степени отличаются?
		if (nDiff != 0)
			return (nDiff < 0) ? -1 : 1;

		size_t pos = 0;
		// найти самые левые различные слова
		while (pos < m1.WordSize() && m1.GetWord(pos) == m2.GetWord(pos)) 
			pos++; 
		// различий не найдено?
		if (pos == m1.WordSize()) return 0;
		// в словах экспонент левые координаты являтся младшими разрядами,
		// поэтому разряды приходится разворачивать
		word w1 = m1.GetWord(pos), w2 = m2.GetWord(pos);
		// находим самые младшие несовпадающие байты
		for (; (w1 & 255) == (w2 & 255); w1 >>= 8, w2 >>= 8);
		// делаем разворот разрядов байта
		static const u8 _revbyte[256] = 
		{
			 0,128,64,192,32,160, 96,224,16,144,80,208,48,176,112,240,
			 8,136,72,200,40,168,104,232,24,152,88,216,56,184,120,248,
			 4,132,68,196,36,164,100,228,20,148,84,212,52,180,116,244,
			12,140,76,204,44,172,108,236,28,156,92,220,60,188,124,252,
			 2,130,66,194,34,162, 98,226,18,146,82,210,50,178,114,242,
			10,138,74,202,42,170,106,234,26,154,90,218,58,186,122,250,
			 6,134,70,198,38,166,102,230,22,150,86,214,54,182,118,246,
			14,142,78,206,46,174,110,238,30,158,94,222,62,190,126,254,
			 1,129,65,193,33,161, 97,225,17,145,81,209,49,177,113,241,
			 9,137,73,201,41,169,105,233,25,153,89,217,57,185,121,249,
			 5,133,69,197,37,165,101,229,21,149,85,213,53,181,117,245,
			13,141,77,205,45,173,109,237,29,157,93,221,61,189,125,253,
			 3,131,67,195,35,163, 99,227,19,147,83,211,51,179,115,243,
			11,139,75,203,43,171,107,235,27,155,91,219,59,187,123,251,
			 7,135,71,199,39,167,103,231,23,151,87,215,55,183,119,247,
			15,143,79,207,47,175,111,239,31,159,95,223,63,191,127,255,
		};
		// и сравниваем "байты-как-числа"
		if (_revbyte[w1 & 255] < _revbyte[w2 & 255])
			return 1;
		return -1;
	}